

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dokick.c
# Opt level: O1

schar down_gate(xchar x,xchar y)

{
  char cVar1;
  boolean bVar2;
  byte bVar3;
  trap *ptVar4;
  byte bVar5;
  
  gate_str = (char *)0x0;
  bVar2 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
  if ((bVar2 != '\0') && (bVar2 = ok_to_quest(), bVar2 == '\0')) {
    return -1;
  }
  cVar1 = (level->dnstair).sx;
  if (((cVar1 == x) && ((level->dnstair).sy == y)) ||
     (((level->sstairs).sx == x && (((level->sstairs).sy == y && ((level->sstairs).up == '\0'))))))
  {
    gate_str = "down the stairs";
    bVar3 = 7;
    if (cVar1 == x) {
      bVar3 = ((level->dnstair).sy != y) << 2 | 3;
    }
  }
  else if (((level->dnladder).sx == x) && ((level->dnladder).sy == y)) {
    gate_str = "down the ladder";
    bVar3 = 5;
  }
  else {
    ptVar4 = t_at(level,(int)x,(int)y);
    bVar3 = 0xff;
    if ((ptVar4 != (trap *)0x0) &&
       (((ptVar4->field_0x8 & 0x20) != 0 &&
        (bVar5 = ptVar4->field_0x8 & 0x1f, (byte)(bVar5 - 0xd) < 2)))) {
      gate_str = "through the hole";
      if (bVar5 == 0xe) {
        gate_str = "through the trap door";
      }
      bVar3 = 0;
    }
  }
  return bVar3;
}

Assistant:

schar down_gate(xchar x, xchar y)
{
	struct trap *ttmp;

	gate_str = 0;
	/* this matches the player restriction in goto_level() */
	if (on_level(&u.uz, &qstart_level) && !ok_to_quest())
	    return MIGR_NOWHERE;

	if ((level->dnstair.sx == x && level->dnstair.sy == y) ||
	    (level->sstairs.sx == x && level->sstairs.sy == y && !level->sstairs.up)) {
	    gate_str = "down the stairs";
	    return (level->dnstair.sx == x && level->dnstair.sy == y) ?
		    MIGR_STAIRS_UP : MIGR_SSTAIRS;
	}
	if (level->dnladder.sx == x && level->dnladder.sy == y) {
	    gate_str = "down the ladder";
	    return MIGR_LADDER_UP;
	}

	if (((ttmp = t_at(level, x, y)) != 0 && ttmp->tseen) &&
		(ttmp->ttyp == TRAPDOOR || ttmp->ttyp == HOLE)) {
	    gate_str = (ttmp->ttyp == TRAPDOOR) ?
		    "through the trap door" : "through the hole";
	    return MIGR_RANDOM;
	}
	return MIGR_NOWHERE;
}